

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

ptrdiff_t __thiscall pugi::xml_node::offset_debug(xml_node *this)

{
  xml_node_struct *pxVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  ptrdiff_t pVar5;
  char_t *pcVar6;
  uint uVar7;
  
  pxVar1 = this->_root;
  pVar5 = -1;
  if (pxVar1 != (xml_node_struct *)0x0) {
    uVar2 = pxVar1->header;
    lVar3 = *(long *)((long)pxVar1 - (uVar2 >> 8));
    lVar4 = *(long *)(lVar3 + 0x10);
    if ((lVar4 != 0) && (*(long *)(lVar3 + 0x18) == 0)) {
      uVar7 = (uint)uVar2 & 0xf;
      if (8 < uVar7) {
LAB_00235f2d:
        __assert_fail("false && \"Invalid node type\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                      ,0x197b,"ptrdiff_t pugi::xml_node::offset_debug() const");
      }
      if ((0x138U >> uVar7 & 1) == 0) {
        if ((0xc4U >> uVar7 & 1) == 0) {
          if (uVar7 == 1) {
            return 0;
          }
          goto LAB_00235f2d;
        }
        pcVar6 = pxVar1->name;
        uVar2 = uVar2 & 0x60;
      }
      else {
        pcVar6 = pxVar1->value;
        uVar2 = uVar2 & 0x50;
      }
      if (uVar2 == 0 && pcVar6 != (char_t *)0x0) {
        pVar5 = (long)pcVar6 - lVar4;
      }
    }
  }
  return pVar5;
}

Assistant:

PUGI__FN ptrdiff_t xml_node::offset_debug() const
	{
		if (!_root) return -1;

		impl::xml_document_struct& doc = impl::get_document(_root);

		// we can determine the offset reliably only if there is exactly once parse buffer
		if (!doc.buffer || doc.extra_buffers) return -1;

		switch (type())
		{
		case node_document:
			return 0;

		case node_element:
		case node_declaration:
		case node_pi:
			return _root->name && (_root->header & impl::xml_memory_page_name_allocated_or_shared_mask) == 0 ? _root->name - doc.buffer : -1;

		case node_pcdata:
		case node_cdata:
		case node_comment:
		case node_doctype:
			return _root->value && (_root->header & impl::xml_memory_page_value_allocated_or_shared_mask) == 0 ? _root->value - doc.buffer : -1;

		default:
			assert(false && "Invalid node type"); // unreachable
			return -1;
		}
	}